

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateInfo<duckdb::hugeint_t>(UpdateInfo *current,hugeint_t *result_data)

{
  uint64_t uVar1;
  uint64_t *__src;
  idx_t i;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = current->N;
  __src = (uint64_t *)((long)&current[1].segment + (ulong)current->max * 4);
  if (uVar3 == 0x800) {
    switchD_016b0717::default(result_data,__src,0x8000);
    return;
  }
  for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
    uVar3 = *(uint *)((long)&current[1].segment + uVar2 * 4);
    uVar1 = __src[1];
    result_data[uVar3].lower = *__src;
    result_data[uVar3].upper = uVar1;
    uVar3 = current->N;
    __src = __src + 2;
  }
  return;
}

Assistant:

static void MergeUpdateInfo(UpdateInfo &current, T *result_data) {
	auto tuples = current.GetTuples();
	auto info_data = current.GetData<T>();
	if (current.N == STANDARD_VECTOR_SIZE) {
		// special case: update touches ALL tuples of this vector
		// in this case we can just memcpy the data
		// since the layout of the update info is guaranteed to be [0, 1, 2, 3, ...]
		memcpy(result_data, info_data, sizeof(T) * current.N);
	} else {
		for (idx_t i = 0; i < current.N; i++) {
			result_data[tuples[i]] = info_data[i];
		}
	}
}